

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O3

void defyx_init_cache(defyx_cache *cache,void *key,size_t keySize)

{
  size_t __n;
  int iVar1;
  string cacheKey;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  local_40 = 0;
  local_38[0] = 0;
  local_48 = local_38;
  std::__cxx11::string::_M_replace((ulong)&local_48,0,(char *)0x0,(ulong)key);
  __n = (cache->cacheKey)._M_string_length;
  if (__n == local_40) {
    if (__n != 0) {
      iVar1 = bcmp((cache->cacheKey)._M_dataplus._M_p,local_48,__n);
      if (iVar1 != 0) goto LAB_00115d0b;
    }
    if (cache->programs[0].size != 0) goto LAB_00115d23;
  }
LAB_00115d0b:
  (*cache->initialize)(cache,key,keySize);
  std::__cxx11::string::_M_assign((string *)&cache->cacheKey);
LAB_00115d23:
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void defyx_init_cache(defyx_cache *cache, const void *key, size_t keySize) {
		assert(cache != nullptr);
		assert(keySize == 0 || key != nullptr);
		std::string cacheKey;
		cacheKey.assign((const char *)key, keySize);
		if (cache->cacheKey != cacheKey || !cache->isInitialized()) {
			cache->initialize(cache, key, keySize);
			cache->cacheKey = cacheKey;
		}
	}